

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

dictionary * dictionary_new(size_t size)

{
  dictionary *pdVar1;
  char **ppcVar2;
  uint *puVar3;
  dictionary *d;
  size_t size_local;
  
  d = (dictionary *)size;
  if (size < 0x80) {
    d = (dictionary *)0x80;
  }
  pdVar1 = (dictionary *)calloc(1,0x28);
  if (pdVar1 != (dictionary *)0x0) {
    pdVar1->size = (ssize_t)d;
    ppcVar2 = (char **)calloc((size_t)d,8);
    pdVar1->val = ppcVar2;
    ppcVar2 = (char **)calloc((size_t)d,8);
    pdVar1->key = ppcVar2;
    puVar3 = (uint *)calloc((size_t)d,4);
    pdVar1->hash = puVar3;
  }
  return pdVar1;
}

Assistant:

dictionary * dictionary_new(size_t size)
{
    dictionary  *   d ;

    /* If no size was specified, allocate space for DICTMINSZ */
    if (size < DICTMINSZ) size = DICTMINSZ ;

    d = (dictionary*) calloc(1, sizeof * d) ;

    if (d) {
        d->size = size ;
        d->val  = (char**) calloc(size, sizeof * d->val);
        d->key  = (char**) calloc(size, sizeof * d->key);
        d->hash = (unsigned*) calloc(size, sizeof * d->hash);
    }
    return d ;
}